

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void Realpath(string *path,string *resolved_path,string *errorMessage)

{
  int *piVar1;
  char *pcVar2;
  char *ret;
  char resolved_name [4096];
  string *errorMessage_local;
  string *resolved_path_local;
  string *path_local;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar2 = realpath(pcVar2,(char *)&ret);
  if (pcVar2 == (char *)0x0) {
    if (errorMessage == (string *)0x0) {
      std::__cxx11::string::operator=((string *)resolved_path,(string *)path);
    }
    else {
      piVar1 = __errno_location();
      if (*piVar1 == 0) {
        std::__cxx11::string::operator=((string *)errorMessage,"Unknown error.");
      }
      else {
        piVar1 = __errno_location();
        pcVar2 = strerror(*piVar1);
        std::__cxx11::string::operator=((string *)errorMessage,pcVar2);
      }
      std::__cxx11::string::operator=((string *)resolved_path,"");
    }
  }
  else {
    std::__cxx11::string::operator=((string *)resolved_path,pcVar2);
  }
  return;
}

Assistant:

inline void Realpath(const std::string& path,
                     std::string& resolved_path,
                     std::string* errorMessage = 0)
{
  char resolved_name[KWSYS_SYSTEMTOOLS_MAXPATH];

  errno = 0;
  char *ret = realpath(path.c_str(), resolved_name);
  if(ret)
    {
    resolved_path = ret;
    }
  else if(errorMessage)
    {
    if(errno)
      {
      *errorMessage = strerror(errno);
      }
    else
      {
      *errorMessage = "Unknown error.";
      }

    resolved_path = "";
    }
  else
    {
    // if path resolution fails, return what was passed in
    resolved_path = path;
    }
}